

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

int run_normal_process(ThreadedReplayer *replayer,
                      vector<const_char_*,_std::allocator<const_char_*>_> *databases,char *whitelist
                      ,uint32_t whitelist_mask,intptr_t metadata_handle)

{
  Hash *__x;
  ResourceTag RVar1;
  uint *puVar2;
  DatabaseInterface *pDVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  __int_type_conflict1 _Var9;
  FILE *__stream;
  pointer pEVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ScratchAllocator *pSVar20;
  ulong uVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar25;
  uint start_index;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  DatabaseInterface *this;
  size_t sVar29;
  long lVar30;
  pointer puVar31;
  uint uVar32;
  pointer puVar33;
  uint *puVar34;
  pointer pEVar35;
  __normal_iterator<EnqueuedWork_*,_std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>_> __i;
  ulong uVar36;
  _Hashtable *this_00;
  pointer pEVar37;
  long in_FS_OFFSET;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  size_t sStackY_1c0;
  int local_1ac;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> graphics_workload;
  anon_class_8_1_ce461c52 run_work;
  uint local_16c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> graphics_hashes;
  StateReplayer state_replayer;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> compute_workload;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> raytracing_workload;
  vector<unsigned_long,_std::allocator<unsigned_long>_> raytracing_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> compute_hashes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resource_hashes;
  DatabaseInterface *local_38;
  
  lVar13 = std::chrono::_V2::steady_clock::now();
  lVar14 = std::chrono::_V2::steady_clock::now();
  create_database((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_38);
  this = local_38;
  if (whitelist == (char *)0x0) {
LAB_00127d6e:
    bVar11 = Fossilize::DatabaseInterface::metadata_handle_is_valid(metadata_handle);
    if ((bVar11) &&
       (bVar11 = Fossilize::DatabaseInterface::import_metadata_from_os_handle(this,metadata_handle),
       !bVar11)) {
      fwrite("Fossilize ERROR: Failed to import metadata.\n",0x2c,1,_stderr);
      goto LAB_0012818d;
    }
    lVar15 = std::chrono::_V2::steady_clock::now();
    lVar16 = std::chrono::_V2::steady_clock::now();
    iVar12 = (*this->_vptr_DatabaseInterface[2])(this);
    if ((char)iVar12 == '\0') {
      fwrite("Fossilize ERROR: Failed to prepare database.\n",0x2d,1,_stderr);
      fflush(_stderr);
      local_1ac = 1;
      goto LAB_0012821b;
    }
    lVar17 = std::chrono::_V2::steady_clock::now();
    Fossilize::StateReplayer::StateReplayer(&state_replayer);
    Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles(&state_replayer,false);
    Fossilize::StateReplayer::set_resolve_shader_module_handles(&state_replayer,false);
    replayer->global_replayer = &state_replayer;
    replayer->global_database = this;
    bVar11 = ThreadedReplayer::init_implicit_whitelist(replayer);
    if (bVar11) {
      resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1ac = 1;
      for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 4) {
        lVar18 = std::chrono::_V2::steady_clock::now();
        graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        RVar1 = *(ResourceTag *)((long)run_normal_process::initial_playback_order + lVar30);
        uVar21 = (ulong)RVar1;
        iVar12 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)RVar1,&graphics_workload,0);
        if ((char)iVar12 == '\0') {
LAB_0012823b:
          fwrite("Fossilize ERROR: Failed to get list of resource hashes.\n",0x38,1,_stderr);
          fflush(_stderr);
          goto LAB_001281f2;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&resource_hashes,
                   (size_type)
                   graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        iVar12 = (*this->_vptr_DatabaseInterface[6])
                           (this,(ulong)RVar1,&graphics_workload,
                            resource_hashes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        puVar31 = resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((char)iVar12 == '\0') goto LAB_0012823b;
        (replayer->per_thread_data).
        super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
        ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag =
             RVar1;
        for (puVar33 = resource_hashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar33 != puVar31; puVar33 = puVar33 + 1)
        {
          graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (*this->_vptr_DatabaseInterface[3])(this,uVar21,*puVar33,&graphics_hashes,0);
          iVar12 = (*this->_vptr_DatabaseInterface[3])(this,uVar21,*puVar33,&graphics_hashes,0);
          if ((char)iVar12 == '\0') {
LAB_001281cb:
            fwrite("Fossilize ERROR: Failed to load blob from cache.\n",0x31,1,_stderr);
            fflush(_stderr);
            goto LAB_001281f2;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&state_json,
                     (size_type)
                     graphics_hashes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
          iVar12 = (*this->_vptr_DatabaseInterface[3])
                             (this,uVar21,*puVar33,&graphics_hashes,
                              state_json.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          if ((char)iVar12 == '\0') goto LAB_001281cb;
          bVar11 = Fossilize::StateReplayer::parse
                             (&state_replayer,&replayer->super_StateCreatorInterface,this,
                              state_json.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)state_json.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)state_json.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          if (!bVar11) {
            fprintf(_stderr,
                    "Fossilize WARN: Did not replay blob (tag: %s, hash: %016lx). See previous logs for context.\n"
                    ,run_normal_process::tag_names[uVar21]);
            fflush(_stderr);
          }
        }
        if (RVar1 == RESOURCE_APPLICATION_INFO) {
          (*(replayer->super_StateCreatorInterface)._vptr_StateCreatorInterface[2])(replayer,0,0,0);
        }
        pcVar28 = run_normal_process::tag_names[uVar21];
        fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",pcVar28);
        fflush(_stderr);
        lVar19 = std::chrono::_V2::steady_clock::now();
        fprintf(_stderr,"Fossilize INFO: Total time decoding %s in main thread: %.3f s\n",
                (double)(lVar19 - lVar18) * 1e-09,pcVar28);
        fflush(_stderr);
      }
      heartbeat();
      ThreadedReplayer::start_worker_threads(replayer);
      graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((replayer->opts).pipeline_hash == 0) {
        local_1ac = 1;
        uVar32 = 0;
        start_index = 0;
        local_16c = 0;
        for (lVar30 = 0; lVar30 != 0xc; lVar30 = lVar30 + 4) {
          run_work.replayer = (ThreadedReplayer *)0x0;
          uVar26 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                   ::stat_tags + lVar30);
          uVar21 = (ulong)uVar26;
          iVar12 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)uVar26,&run_work,0);
          if ((char)iVar12 == '\0') {
LAB_00128ed5:
            pcVar28 = "Fossilize ERROR: Failed to get list of resource hashes.\n";
            sStackY_1c0 = 0x38;
LAB_001286fe:
            fwrite(pcVar28,sStackY_1c0,1,_stderr);
            fflush(_stderr);
            goto LAB_00128eac;
          }
          uVar27 = (uint)run_work.replayer;
          if (uVar21 == 9) {
            uVar32 = (replayer->opts).start_raytracing_index;
            uVar26 = (replayer->opts).end_raytracing_index;
            uVar36 = (ulong)uVar26;
            if (uVar27 <= uVar26) {
              uVar36 = (ulong)run_work.replayer & 0xffffffff;
            }
            if ((uint)uVar36 <= uVar32) {
              uVar32 = (uint)uVar36;
            }
            pvVar25 = &raytracing_hashes;
            uVar26 = uVar32;
          }
          else if (uVar26 == 7) {
            start_index = (replayer->opts).start_compute_index;
            uVar26 = (replayer->opts).end_compute_index;
            uVar36 = (ulong)uVar26;
            if (uVar27 <= uVar26) {
              uVar36 = (ulong)run_work.replayer & 0xffffffff;
            }
            if ((uint)uVar36 <= start_index) {
              start_index = (uint)uVar36;
            }
            pvVar25 = &compute_hashes;
            uVar26 = start_index;
          }
          else {
            if (uVar26 != 6) {
              __assert_fail("hashes",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                            ,0xf3e,
                            "int run_normal_process(ThreadedReplayer &, const vector<const char *> &, const char *, uint32_t, intptr_t)"
                           );
            }
            local_16c = (replayer->opts).start_graphics_index;
            uVar26 = (replayer->opts).end_graphics_index;
            uVar36 = (ulong)uVar26;
            if (uVar27 <= uVar26) {
              uVar36 = (ulong)run_work.replayer & 0xffffffff;
            }
            if ((uint)uVar36 <= local_16c) {
              local_16c = (uint)uVar36;
            }
            pvVar25 = &graphics_hashes;
            uVar26 = local_16c;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (pvVar25,(size_type)run_work.replayer);
          iVar12 = (*this->_vptr_DatabaseInterface[6])
                             (this,uVar21,&run_work,
                              (pvVar25->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start);
          if ((char)iVar12 == '\0') goto LAB_00128ed5;
          __n = uVar36 * 8 + (ulong)uVar26 * -8;
          if (__n != 0) {
            puVar31 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            memmove(puVar31,puVar31 + uVar26,__n);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                    (pvVar25,(const_iterator)
                             ((pvVar25->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + ((int)uVar36 - uVar26)),
                     (const_iterator)
                     (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
          pDVar3 = (replayer->replayer_cache_db)._M_t.
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          if (pDVar3 != (DatabaseInterface *)0x0) {
            graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar12 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,uVar21,&compute_workload,0);
            if (((char)iVar12 != '\0') &&
               (compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&graphics_workload
                         ,(size_type)
                          compute_workload.
                          super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                          super__Vector_impl_data._M_start);
              iVar12 = (*pDVar3->_vptr_DatabaseInterface[6])
                                 (pDVar3,uVar21,&compute_workload,
                                  graphics_workload.
                                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              if ((char)iVar12 != '\0') {
                this_00 = &replayer->cached_blobs[uVar21]._M_h;
                std::__detail::
                _Rehash_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
                ::reserve((_Rehash_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
                           *)this_00,
                          (size_t)compute_workload.
                                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                pEVar10 = graphics_workload.
                          super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                for (pEVar35 = graphics_workload.
                               super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                               _M_impl.super__Vector_impl_data._M_start; pEVar35 != pEVar10;
                    pEVar35 = (pointer)&pEVar35->func) {
                  raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)pEVar35;
                  std::__detail::
                  _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)this_00,(value_type *)&raytracing_workload);
                }
              }
            }
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &graphics_workload);
          }
          puVar33 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar18 = 0;
          for (puVar31 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start; puVar31 != puVar33;
              puVar31 = puVar31 + 1) {
            graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (*this->_vptr_DatabaseInterface[3])(this,uVar21,*puVar31,&graphics_workload,0,1);
            iVar12 = (*this->_vptr_DatabaseInterface[3])
                               (this,uVar21,*puVar31,&graphics_workload,0,0);
            if ((char)iVar12 == '\0') {
              pcVar28 = "Fossilize ERROR: Failed to load blob from cache.\n";
              sStackY_1c0 = 0x31;
              goto LAB_001286fe;
            }
            lVar18 = (long)&(graphics_workload.
                             super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
                             .super__Vector_impl_data._M_start)->order_index + lVar18;
          }
          fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                  run_normal_process::tag_names[uVar21],lVar18);
          fflush(_stderr);
        }
LAB_00128718:
        pSVar20 = Fossilize::StateReplayer::get_allocator(&state_replayer);
        Fossilize::ScratchAllocator::reset(pSVar20);
        graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        raytracing_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        raytracing_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        raytracing_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
                  (replayer,replayer->deferred_graphics,&replayer->graphics_pipelines,
                   &replayer->graphics_parents,&graphics_workload,&graphics_hashes,local_16c);
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredComputeInfo>
                  (replayer,replayer->deferred_compute,&replayer->compute_pipelines,
                   &replayer->compute_parents,&compute_workload,&compute_hashes,start_index);
        ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredRayTracingInfo>
                  (replayer,replayer->deferred_raytracing,&replayer->raytracing_pipelines,
                   &replayer->raytracing_parents,&raytracing_workload,&raytracing_hashes,uVar32);
        pEVar35 = graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pEVar10 = graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar18 = (long)graphics_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)graphics_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar21 = lVar18 / 0x28;
          lVar30 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar30 == 0; lVar30 = lVar30 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                    (graphics_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     graphics_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                      (pEVar10,pEVar35);
          }
          else {
            pEVar37 = pEVar10 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                      (pEVar10,pEVar37);
            for (; pEVar37 != pEVar35; pEVar37 = pEVar37 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__0>>
                        (pEVar37);
            }
          }
        }
        pEVar35 = compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pEVar10 = compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
            .super__Vector_impl_data._M_start !=
            compute_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          lVar18 = (long)compute_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)compute_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar21 = lVar18 / 0x28;
          lVar30 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar30 == 0; lVar30 = lVar30 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                    (compute_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     compute_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                      (pEVar10,pEVar35);
          }
          else {
            pEVar37 = pEVar10 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                      (pEVar10,pEVar37);
            for (; pEVar37 != pEVar35; pEVar37 = pEVar37 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__1>>
                        (pEVar37);
            }
          }
        }
        pEVar35 = raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar10 = raytracing_workload.
                  super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (raytracing_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            raytracing_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar18 = (long)raytracing_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)raytracing_workload.
                         super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar21 = lVar18 / 0x28;
          lVar30 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar30 == 0; lVar30 = lVar30 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                    (raytracing_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     raytracing_workload.
                     super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                      (pEVar10,pEVar35);
          }
          else {
            pEVar37 = pEVar10 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Iter_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                      (pEVar10,pEVar37);
            for (; pEVar37 != pEVar35; pEVar37 = pEVar37 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnqueuedWork*,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>>,__gnu_cxx::__ops::_Val_comp_iter<run_normal_process(ThreadedReplayer&,std::vector<char_const*,std::allocator<char_const*>>const&,char_const*,unsigned_int,long)::__2>>
                        (pEVar37);
            }
          }
        }
        run_work.replayer = replayer;
        run_normal_process::anon_class_8_1_ce461c52::operator()(&run_work,&graphics_workload);
        run_normal_process::anon_class_8_1_ce461c52::operator()(&run_work,&compute_workload);
        run_normal_process::anon_class_8_1_ce461c52::operator()(&run_work,&raytracing_workload);
        ThreadedReplayer::tear_down_threads(replayer);
        local_1ac = 0;
        fprintf(_stderr,"Fossilize INFO: Total binary size for %s: %lu (%lu compressed)\n",
                "Shader Module",
                (replayer->shader_module_total_size).super___atomic_base<unsigned_long>._M_i,
                (replayer->shader_module_total_compressed_size).super___atomic_base<unsigned_long>.
                _M_i);
        fflush(_stderr);
        sVar22 = replayer->compute_pipelines_cleared +
                 (replayer->compute_pipelines)._M_h._M_element_count;
        replayer->compute_pipelines_cleared = sVar22;
        sVar29 = replayer->graphics_pipelines_cleared +
                 (replayer->graphics_pipelines)._M_h._M_element_count;
        replayer->graphics_pipelines_cleared = sVar29;
        sVar24 = replayer->raytracing_pipelines_cleared +
                 (replayer->raytracing_pipelines)._M_h._M_element_count;
        replayer->raytracing_pipelines_cleared = sVar24;
        sVar4 = (replayer->samplers)._M_h._M_element_count;
        sVar5 = (replayer->layouts)._M_h._M_element_count;
        sVar6 = (replayer->pipeline_layouts)._M_h._M_element_count;
        sVar7 = (replayer->shader_modules).hash_to_objects._M_h._M_element_count;
        sVar8 = (replayer->render_passes)._M_h._M_element_count;
        lVar30 = std::chrono::_V2::steady_clock::now();
        fprintf(_stderr,"Fossilize INFO: Opening archive took %ld ms:\n",(lVar15 - lVar14) / 1000000
               );
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Parsing archive took %ld ms:\n",(lVar17 - lVar16) / 1000000
               );
        fflush(_stderr);
        if (((replayer->opts).on_disk_pipeline_cache_path._M_string_length != 0) &&
           (((replayer->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
            supports_pipeline_feedback == true)) {
          fprintf(_stderr,"Fossilize INFO: Pipeline cache hits reported: %u\n",
                  (ulong)(replayer->pipeline_cache_hits).super___atomic_base<unsigned_int>._M_i);
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO: Pipeline cache misses reported: %u\n",
                  (ulong)(replayer->pipeline_cache_misses).super___atomic_base<unsigned_int>._M_i);
          fflush(_stderr);
        }
        _Var9 = (replayer->shader_module_ns).super___atomic_base<unsigned_long>._M_i;
        auVar38._8_4_ = (int)(_Var9 >> 0x20);
        auVar38._0_8_ = _Var9;
        auVar38._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u shader modules took %.3f s (accumulated time)\n",
                ((auVar38._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09,
                (ulong)(replayer->shader_module_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Shader cache evicted %u shader modules in total\n",
                (ulong)(replayer->shader_module_evicted_count).super___atomic_base<unsigned_int>.
                       _M_i);
        fflush(_stderr);
        _Var9 = (replayer->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar39._8_4_ = (int)(_Var9 >> 0x20);
        auVar39._0_8_ = _Var9;
        auVar39._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u graphics pipelines took %.3f s (accumulated time)\n"
                ,((auVar39._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09,
                (ulong)(replayer->graphics_pipeline_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        _Var9 = (replayer->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar40._8_4_ = (int)(_Var9 >> 0x20);
        auVar40._0_8_ = _Var9;
        auVar40._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u compute pipelines took %.3f s (accumulated time)\n"
                ,((auVar40._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09,
                (ulong)(replayer->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i);
        fflush(_stderr);
        _Var9 = (replayer->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i;
        auVar41._8_4_ = (int)(_Var9 >> 0x20);
        auVar41._0_8_ = _Var9;
        auVar41._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Playing back %u raytracing pipelines took %.3f s (accumulated time)\n"
                ,((auVar41._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09,
                (ulong)(replayer->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i)
        ;
        fflush(_stderr);
        _Var9 = (replayer->total_idle_ns).super___atomic_base<unsigned_long>._M_i;
        auVar42._8_4_ = (int)(_Var9 >> 0x20);
        auVar42._0_8_ = _Var9;
        auVar42._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Threads were idling in total for %.3f s (accumulated time)\n",
                ((auVar42._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09);
        fflush(_stderr);
        _Var9 = (replayer->thread_total_ns).super___atomic_base<unsigned_long>._M_i;
        auVar43._8_4_ = (int)(_Var9 >> 0x20);
        auVar43._0_8_ = _Var9;
        auVar43._12_4_ = 0x45300000;
        fprintf(_stderr,
                "Fossilize INFO: Threads were active in total for %.3f s (accumulated time)\n",
                ((auVar43._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Var9) - 4503599627370496.0)) * 1e-09);
        fflush(_stderr);
        __stream = _stderr;
        _Var9 = (replayer->total_peak_memory).super___atomic_base<unsigned_long>._M_i;
        pSVar20 = Fossilize::StateReplayer::get_allocator(&state_replayer);
        sVar23 = Fossilize::ScratchAllocator::get_peak_memory_consumption(pSVar20);
        lVar14 = sVar23 + _Var9;
        auVar44._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar44._0_8_ = lVar14;
        auVar44._12_4_ = 0x45300000;
        fprintf(__stream,"Fossilize INFO: Total peak memory consumption by parser: %.3f MB.\n",
                ((auVar44._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 1e-06);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO: Replayed %lu objects in %ld ms:\n",
                sVar29 + sVar22 + sVar24 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8,
                (lVar30 - lVar13) / 1000000);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   samplers:              %7lu\n",
                (replayer->samplers)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   descriptor set layouts:%7lu\n",
                (replayer->layouts)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   pipeline layouts:      %7lu\n",
                (replayer->pipeline_layouts)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   render passes:         %7lu\n",
                (replayer->render_passes)._M_h._M_element_count);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   compute pipelines:     %7lu\n",
                replayer->compute_pipelines_cleared);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   graphics pipelines:    %7lu\n",
                replayer->graphics_pipelines_cleared);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize INFO:   raytracing pipelines:  %7lu\n",
                replayer->raytracing_pipelines_cleared);
        fflush(_stderr);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&raytracing_workload);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&compute_workload);
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::~vector(&graphics_workload);
        this = local_38;
      }
      else {
        __x = &(replayer->opts).pipeline_hash;
        for (lVar30 = 0; lVar30 != 0xc; lVar30 = lVar30 + 4) {
          graphics_workload.super__Vector_base<EnqueuedWork,_std::allocator<EnqueuedWork>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          uVar32 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                   ::stat_tags + lVar30);
          iVar12 = (*this->_vptr_DatabaseInterface[3])
                             (this,(ulong)uVar32,*__x,&graphics_workload,0,0);
          if ((char)iVar12 != '\0') {
            pvVar25 = &graphics_hashes;
            if (uVar32 != 6) {
              if (uVar32 == 9) {
                pvVar25 = &raytracing_hashes;
              }
              else {
                pvVar25 = &compute_hashes;
                if (uVar32 != 7) goto LAB_00128675;
              }
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar25,__x);
          }
LAB_00128675:
        }
        uVar32 = 0;
        if ((graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish) ||
           (compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start !=
            compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish)) {
          start_index = 0;
          local_16c = 0;
          goto LAB_00128718;
        }
        start_index = 0;
        local_16c = 0;
        uVar32 = 0;
        if (raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            raytracing_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00128718;
        fprintf(_stderr,"Fossilize ERROR: Specified pipeline hash %016lx not found in database.\n",
                *__x);
        fflush(_stderr);
        local_1ac = 1;
      }
LAB_00128eac:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&raytracing_hashes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&compute_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&graphics_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
      ;
LAB_001281f2:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&resource_hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
      ;
    }
    else {
      fwrite("Fossilize ERROR: Failed to initialize implicit whitelist.\n",0x3a,1,_stderr);
      fflush(_stderr);
      local_1ac = 1;
    }
    Fossilize::StateReplayer::~StateReplayer(&state_replayer);
  }
  else {
    Fossilize::DatabaseInterface::set_whitelist_tag_mask(local_38,whitelist_mask);
    bVar11 = Fossilize::DatabaseInterface::load_whitelist_database(this,whitelist);
    if (bVar11) {
      iVar12 = (*this->_vptr_DatabaseInterface[10])(this);
      if ((char)iVar12 != '\0') {
        puVar2 = (replayer->opts).implicit_whitelist_database_indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar34 = (replayer->opts).implicit_whitelist_database_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar34 != puVar2; puVar34 = puVar34 + 1) {
          Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(this,*puVar34);
        }
      }
      goto LAB_00127d6e;
    }
    fprintf(_stderr,"Fossilize ERROR: Failed to load whitelist database: %s.\n",whitelist);
LAB_0012818d:
    fflush(_stderr);
    local_1ac = 1;
  }
  if (this == (DatabaseInterface *)0x0) {
    return local_1ac;
  }
LAB_0012821b:
  (*this->_vptr_DatabaseInterface[1])(this);
  return local_1ac;
}

Assistant:

static int run_normal_process(ThreadedReplayer &replayer, const vector<const char *> &databases,
                              const char *whitelist, uint32_t whitelist_mask,
                              intptr_t metadata_handle)
{
	auto start_time = chrono::steady_clock::now();
	auto start_create_archive = chrono::steady_clock::now();
	auto resolver = create_database(databases);

	if (whitelist)
	{
		resolver->set_whitelist_tag_mask(whitelist_mask);
		if (!resolver->load_whitelist_database(whitelist))
		{
			LOGE("Failed to load whitelist database: %s.\n", whitelist);
			return EXIT_FAILURE;
		}

		if (resolver->has_sub_databases())
			for (unsigned index : replayer.opts.implicit_whitelist_database_indices)
				resolver->promote_sub_database_to_whitelist(index);
	}

	if (DatabaseInterface::metadata_handle_is_valid(metadata_handle))
	{
		if (!resolver->import_metadata_from_os_handle(metadata_handle))
		{
			LOGE("Failed to import metadata.\n");
			return EXIT_FAILURE;
		}
	}

	auto end_create_archive = chrono::steady_clock::now();

	auto start_prepare = chrono::steady_clock::now();
	if (!resolver->prepare())
	{
		LOGE("Failed to prepare database.\n");
		return EXIT_FAILURE;
	}
	auto end_prepare = chrono::steady_clock::now();

	StateReplayer state_replayer;
	state_replayer.set_resolve_derivative_pipeline_handles(false);
	state_replayer.set_resolve_shader_module_handles(false);
	replayer.global_replayer = &state_replayer;
	replayer.global_database = resolver.get();

	if (!replayer.init_implicit_whitelist())
	{
		LOGE("Failed to initialize implicit whitelist.\n");
		return EXIT_FAILURE;
	}

	vector<Hash> resource_hashes;
	vector<uint8_t> state_json;

	static const ResourceTag initial_playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread. Dependent immutable samplers are pulled in on-demand.
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
	};

	static const ResourceTag threaded_playback_order[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : initial_playback_order)
	{
		auto main_thread_start = std::chrono::steady_clock::now();
		size_t tag_total_size = 0;
		size_t tag_total_size_compressed = 0;
		size_t resource_hash_count = 0;

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		resource_hashes.resize(resource_hash_count);

		if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, resource_hashes.data()))
		{
			LOGE("Failed to get list of resource hashes.\n");
			return EXIT_FAILURE;
		}

		auto &per_thread_data = replayer.get_per_thread_data();
		per_thread_data.expected_tag = tag;

		for (auto &hash : resource_hashes)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			{
				tag_total_size_compressed += state_json_size;
			}			

			if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);
			tag_total_size += state_json_size;

			if (!resolver->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!state_replayer.parse(replayer, resolver.get(), state_json.data(), state_json.size()))
				LOGW("Did not replay blob (tag: %s, hash: %016" PRIx64 "). See previous logs for context.\n", tag_names[tag], hash);
		}

		if (tag == RESOURCE_APPLICATION_INFO)
		{
			// Just in case there was no application info in the database, we provide a dummy info,
			// this makes sure the VkDevice is created.
			replayer.set_application_info(0, nullptr, nullptr);
		}

		LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
		     uint64_t(tag_total_size),
		     uint64_t(tag_total_size_compressed));

		auto main_thread_end = std::chrono::steady_clock::now();
		auto duration = std::chrono::duration_cast<std::chrono::nanoseconds>(main_thread_end - main_thread_start).count();
		LOGI("Total time decoding %s in main thread: %.3f s\n", tag_names[tag], duration * 1e-9);
	}

	heartbeat();

	// Now we've laid the initial ground work, kick off worker threads.
	replayer.start_worker_threads();

	vector<Hash> graphics_hashes;
	vector<Hash> compute_hashes;
	vector<Hash> raytracing_hashes;
	unsigned graphics_start_index = 0;
	unsigned compute_start_index = 0;
	unsigned raytracing_start_index = 0;

	if (replayer.opts.pipeline_hash != 0)
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t state_json_size = 0;
			if (resolver->read_entry(tag, replayer.opts.pipeline_hash, &state_json_size, nullptr, 0))
			{
				if (tag == RESOURCE_GRAPHICS_PIPELINE)
					graphics_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_COMPUTE_PIPELINE)
					compute_hashes.push_back(replayer.opts.pipeline_hash);
				else if (tag == RESOURCE_RAYTRACING_PIPELINE)
					raytracing_hashes.push_back(replayer.opts.pipeline_hash);
			}
		}

		if (graphics_hashes.empty() && compute_hashes.empty() && raytracing_hashes.empty())
		{
			LOGE("Specified pipeline hash %016" PRIx64 " not found in database.\n",
			     replayer.opts.pipeline_hash);
			return EXIT_FAILURE;
		}
	}
	else
	{
		for (auto &tag : threaded_playback_order)
		{
			size_t tag_total_size = 0;
			size_t tag_total_size_compressed = 0;
			size_t resource_hash_count = 0;

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, nullptr))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			unsigned start_index = 0;
			unsigned end_index = resource_hash_count;

			vector<Hash> *hashes = nullptr;

			if (tag == RESOURCE_GRAPHICS_PIPELINE)
			{
				hashes = &graphics_hashes;

				end_index = min(end_index, replayer.opts.end_graphics_index);
				start_index = max(start_index, replayer.opts.start_graphics_index);
				start_index = min(end_index, start_index);
				graphics_start_index = start_index;

			}
			else if (tag == RESOURCE_COMPUTE_PIPELINE)
			{
				hashes = &compute_hashes;

				end_index = min(end_index, replayer.opts.end_compute_index);
				start_index = max(start_index, replayer.opts.start_compute_index);
				start_index = min(end_index, start_index);
				compute_start_index = start_index;
			}
			else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			{
				hashes = &raytracing_hashes;

				end_index = min(end_index, replayer.opts.end_raytracing_index);
				start_index = max(start_index, replayer.opts.start_raytracing_index);
				start_index = min(end_index, start_index);
				raytracing_start_index = start_index;
			}

			assert(hashes);
			hashes->resize(resource_hash_count);

			if (!resolver->get_hash_list_for_resource_tag(tag, &resource_hash_count, hashes->data()))
			{
				LOGE("Failed to get list of resource hashes.\n");
				return EXIT_FAILURE;
			}

			move(begin(*hashes) + start_index, begin(*hashes) + end_index, begin(*hashes));
			hashes->erase(begin(*hashes) + (end_index - start_index), end(*hashes));

			if (replayer.replayer_cache_db)
				populate_blob_hash_set(replayer.cached_blobs[tag], tag, *replayer.replayer_cache_db);

			for (auto &hash : *hashes)
			{
				size_t state_json_size = 0;
				if (resolver->read_entry(tag, hash, &state_json_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
				{
					tag_total_size_compressed += state_json_size;
				}

				if (!resolver->read_entry(tag, hash, &state_json_size, nullptr, 0))
				{
					LOGE("Failed to load blob from cache.\n");
					return EXIT_FAILURE;
				}
				tag_total_size += state_json_size;
			}

			LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[tag],
			     uint64_t(tag_total_size),
			     uint64_t(tag_total_size_compressed));
		}
	}

	// Done parsing static objects.
	state_replayer.get_allocator().reset();

	vector<EnqueuedWork> graphics_workload;
	vector<EnqueuedWork> compute_workload;
	vector<EnqueuedWork> raytracing_workload;
	replayer.enqueue_deferred_pipelines(replayer.deferred_graphics, replayer.graphics_pipelines, replayer.graphics_parents,
	                                    graphics_workload,
	                                    graphics_hashes, graphics_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_compute, replayer.compute_pipelines, replayer.compute_parents,
	                                    compute_workload, compute_hashes,
	                                    compute_start_index);
	replayer.enqueue_deferred_pipelines(replayer.deferred_raytracing, replayer.raytracing_pipelines, replayer.raytracing_parents,
	                                    raytracing_workload, raytracing_hashes,
	                                    raytracing_start_index);

	sort(begin(graphics_workload), end(graphics_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(compute_workload), end(compute_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});
	sort(begin(raytracing_workload), end(raytracing_workload), [](const EnqueuedWork &a, const EnqueuedWork &b) {
		return a.order_index < b.order_index;
	});

	const auto run_work = [&replayer](const std::vector<EnqueuedWork> &workload) {
		for (auto &work : workload)
		{
			work.func();
			heartbeat();
		}

		// Need to synchronize worker threads between pipeline types to avoid a race condition
		// where memory iteration 1 for a GPL link is running, and then compute starts running
		// with only memory iteration 0 (< 1024 pipelines).
		// Then we get the pattern of:
		// - Link GPL pipeline iteration 1
		// - Sync memory context 0
		// - LRU maintenance memory context 0
		// - Free pipelines (race condition!)
		// To avoid shenanigans, synchronize everything between types.
		replayer.sync_worker_threads();
	};

	run_work(graphics_workload);
	run_work(compute_workload);
	run_work(raytracing_workload);

	replayer.tear_down_threads();

	LOGI("Total binary size for %s: %" PRIu64 " (%" PRIu64 " compressed)\n", tag_names[RESOURCE_SHADER_MODULE],
	     uint64_t(replayer.shader_module_total_size.load()),
	     uint64_t(replayer.shader_module_total_compressed_size.load()));

	replayer.compute_pipelines_cleared += replayer.compute_pipelines.size();
	replayer.graphics_pipelines_cleared += replayer.graphics_pipelines.size();
	replayer.raytracing_pipelines_cleared += replayer.raytracing_pipelines.size();

	unsigned long total_size =
		replayer.samplers.size() +
		replayer.layouts.size() +
		replayer.pipeline_layouts.size() +
		replayer.shader_modules.get_current_object_count() +
		replayer.render_passes.size() +
		replayer.compute_pipelines_cleared +
		replayer.graphics_pipelines_cleared +
		replayer.raytracing_pipelines_cleared;

	long elapsed_ms_prepare = chrono::duration_cast<chrono::milliseconds>(end_prepare - start_prepare).count();
	long elapsed_ms_read_archive = chrono::duration_cast<chrono::milliseconds>(end_create_archive - start_create_archive).count();
	long elapsed_ms = chrono::duration_cast<chrono::milliseconds>(chrono::steady_clock::now() - start_time).count();

	LOGI("Opening archive took %ld ms:\n", elapsed_ms_read_archive);
	LOGI("Parsing archive took %ld ms:\n", elapsed_ms_prepare);

	if (!replayer.opts.on_disk_pipeline_cache_path.empty() && replayer.device->pipeline_feedback_enabled())
	{
		LOGI("Pipeline cache hits reported: %u\n", replayer.pipeline_cache_hits.load());
		LOGI("Pipeline cache misses reported: %u\n", replayer.pipeline_cache_misses.load());
	}

	LOGI("Playing back %u shader modules took %.3f s (accumulated time)\n",
	     replayer.shader_module_count.load(),
	     replayer.shader_module_ns.load() * 1e-9);

	LOGI("Shader cache evicted %u shader modules in total\n",
	     replayer.shader_module_evicted_count.load());

	LOGI("Playing back %u graphics pipelines took %.3f s (accumulated time)\n",
	     replayer.graphics_pipeline_count.load(),
	     replayer.graphics_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u compute pipelines took %.3f s (accumulated time)\n",
	     replayer.compute_pipeline_count.load(),
	     replayer.compute_pipeline_ns.load() * 1e-9);

	LOGI("Playing back %u raytracing pipelines took %.3f s (accumulated time)\n",
	     replayer.raytracing_pipeline_count.load(),
	     replayer.raytracing_pipeline_ns.load() * 1e-9);

	LOGI("Threads were idling in total for %.3f s (accumulated time)\n",
	     replayer.total_idle_ns.load() * 1e-9);

	LOGI("Threads were active in total for %.3f s (accumulated time)\n",
	     replayer.thread_total_ns.load() * 1e-9);

	LOGI("Total peak memory consumption by parser: %.3f MB.\n",
	     (replayer.total_peak_memory.load() + state_replayer.get_allocator().get_peak_memory_consumption()) * 1e-6);

	LOGI("Replayed %lu objects in %ld ms:\n", total_size, elapsed_ms);
	LOGI("  samplers:              %7lu\n", (unsigned long)replayer.samplers.size());
	LOGI("  descriptor set layouts:%7lu\n", (unsigned long)replayer.layouts.size());
	LOGI("  pipeline layouts:      %7lu\n", (unsigned long)replayer.pipeline_layouts.size());
	LOGI("  render passes:         %7lu\n", (unsigned long)replayer.render_passes.size());
	LOGI("  compute pipelines:     %7lu\n", (unsigned long)replayer.compute_pipelines_cleared);
	LOGI("  graphics pipelines:    %7lu\n", (unsigned long)replayer.graphics_pipelines_cleared);
	LOGI("  raytracing pipelines:  %7lu\n", (unsigned long)replayer.raytracing_pipelines_cleared);

	return EXIT_SUCCESS;
}